

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printc.cc
# Opt level: O1

void __thiscall PrintC::opPtrsub(PrintC *this,PcodeOp *op)

{
  type_metatype tVar1;
  Varnode *this_00;
  TypeSpacebase *this_01;
  _func_int **pp_Var2;
  bool bVar3;
  HighVariable *this_02;
  TypeField *pTVar4;
  Scope *this_03;
  SymbolEntry *pSVar5;
  Datatype *pDVar6;
  LowlevelError *pLVar7;
  uint m;
  uint uVar8;
  bool bVar9;
  OpToken *tok;
  bool bVar10;
  bool bVar11;
  string fieldname;
  int4 newoff;
  ostringstream s;
  ulong local_1f8;
  undefined1 local_1f0 [36];
  int4 local_1cc;
  string local_1c8 [16];
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined1 local_198 [16];
  int4 local_188;
  ios_base local_138 [264];
  
  this_00 = *(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  this_02 = Varnode::getHigh(this_00);
  HighVariable::updateType(this_02);
  pDVar6 = this_02->type;
  if (pDVar6->metatype != TYPE_PTR) {
    (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])(this);
    pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
    local_1a8._M_allocated_capacity = (size_type)local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1a8,"PTRSUB off of non-pointer type","");
    LowlevelError::LowlevelError(pLVar7,(string *)&local_1a8);
    __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
  }
  this_01 = (TypeSpacebase *)pDVar6[1]._vptr_Datatype;
  uVar8 = (this->super_PrintLanguage).mods;
  bVar10 = (uVar8 & 0x60) != 0;
  if (((~this_00->flags & 0x50) != 0) ||
     (bVar3 = true, this_00->def->opcode->opcode - CPUI_SEGMENTOP < 0xfffffffe)) {
    bVar3 = false;
  }
  tVar1 = (this_01->super_Datatype).metatype;
  if (tVar1 == TYPE_SPACEBASE) {
    this_03 = TypeSpacebase::getMap(this_01);
    TypeSpacebase::getAddress
              ((TypeSpacebase *)local_1f0,(uintb)this_01,
               (int4)((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl
                      .super__Vector_impl_data._M_start[1]->loc).offset,
               (Address *)(ulong)(uint)this_00->size);
    if ((AddrSpace *)local_1f0._0_8_ == (AddrSpace *)0x0) {
      pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
      local_1a8._M_allocated_capacity = (size_type)local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,"Unable to generate proper address from spacebase","");
      LowlevelError::LowlevelError(pLVar7,(string *)&local_1a8);
      __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    local_1a8._M_allocated_capacity = 0;
    pSVar5 = Scope::queryContainer(this_03,(Address *)local_1f0,1,(Address *)&local_1a8);
    if (pSVar5 == (SymbolEntry *)0x0) {
      bVar9 = false;
      bVar3 = bVar10;
    }
    else {
      tVar1 = pSVar5->symbol->type->metatype;
      bVar3 = true;
      bVar9 = bVar10;
      if (tVar1 != TYPE_ARRAY) {
        bVar9 = false;
        bVar3 = tVar1 == TYPE_CODE || (uVar8 & 0x60) != 0;
      }
    }
    if (bVar3 != true || bVar9) {
      if (bVar3) {
        tok = &subscript;
      }
      else {
        tok = &addressof;
      }
      PrintLanguage::pushOp(&this->super_PrintLanguage,tok,op);
    }
    if (pSVar5 == (SymbolEntry *)0x0) {
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[6])(this,local_1f0,0,op);
    }
    else {
      pp_Var2 = (this->super_PrintLanguage)._vptr_PrintLanguage;
      uVar8 = (local_1f0._8_4_ - (int)(pSVar5->addr).offset) + pSVar5->offset;
      if (uVar8 == 0) {
        (*pp_Var2[5])(this,pSVar5->symbol,0,op);
      }
      else {
        (*pp_Var2[7])(this,pSVar5->symbol,(ulong)uVar8,0,0,op,0);
      }
    }
    if (bVar9) {
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,op);
    }
  }
  else {
    m = uVar8 & 0xffffff9f;
    if (tVar1 == TYPE_ARRAY) {
      if (((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
           super__Vector_impl_data._M_start[1]->loc).offset != 0) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])(this);
        pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
        local_1a8._M_allocated_capacity = (size_type)local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,"PTRSUB with non-zero offset into array type","");
        LowlevelError::LowlevelError(pLVar7,(string *)&local_1a8);
        __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      if ((uVar8 & 0x60) != 0) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,op);
        if (!bVar3) {
          PrintLanguage::pushOp(&this->super_PrintLanguage,&dereference,op);
        }
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m);
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,op);
        return;
      }
      if (!bVar3) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&dereference,op);
      }
      PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m);
      return;
    }
    if (tVar1 != TYPE_STRUCT) {
      (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x13])();
      pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
      local_1a8._M_allocated_capacity = (size_type)local_198;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1a8,"PTRSUB off of non structured pointer type","");
      LowlevelError::LowlevelError(pLVar7,(string *)&local_1a8);
      __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    local_1f8 = (ulong)(uint)pDVar6[1].size *
                ((op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                 super__Vector_impl_data._M_start[1]->loc).offset;
    local_1f0._0_8_ = local_1f0 + 0x10;
    local_1f0._8_8_ = 0;
    local_1f0[0x10] = 0;
    pTVar4 = TypeStruct::getField((TypeStruct *)this_01,(int4)local_1f8,0,&local_1cc);
    if (pTVar4 == (TypeField *)0x0) {
      if ((ulong)(long)(this_01->super_Datatype).size <= local_1f8) {
        pLVar7 = (LowlevelError *)__cxa_allocate_exception(0x20);
        local_1a8._M_allocated_capacity = (size_type)local_198;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,"PTRSUB out of bounds into struct","");
        LowlevelError::LowlevelError(pLVar7,(string *)&local_1a8);
        __cxa_throw(pLVar7,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8._M_local_buf,"field_0x",8);
      *(uint *)(local_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 8) =
           *(uint *)(local_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18) + 8) & 0xffffffb5
           | 8;
      std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)local_1f0,local_1c8);
      if ((undefined1 *)local_1c8._0_8_ != local_1b8) {
        operator_delete((void *)local_1c8._0_8_);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
      pDVar6 = (Datatype *)0x0;
    }
    else {
      std::__cxx11::string::_M_assign((string *)local_1f0);
      pDVar6 = pTVar4->type;
      local_1f8 = (ulong)(uint)pTVar4->offset;
    }
    if (pDVar6 == (Datatype *)0x0) {
      bVar9 = false;
    }
    else {
      bVar11 = (uVar8 & 0x60) != 0;
      bVar10 = pDVar6->metatype == TYPE_ARRAY;
      bVar9 = bVar10 && bVar11;
      bVar10 = bVar10 || bVar11;
    }
    local_188 = (int4)local_1f8;
    local_198._8_8_ = this_01;
    if (bVar10) {
      if (bVar9) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&subscript,op);
      }
      if (bVar3) {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&object_member,op);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m | 0x20);
        local_1a8._M_allocated_capacity = (size_type)local_1f0;
        local_1a8._8_8_ = 0x800000005;
        PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&local_1a8);
      }
      else {
        PrintLanguage::pushOp(&this->super_PrintLanguage,&pointer_member,op);
        PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m);
        local_1a8._M_allocated_capacity = (size_type)local_1f0;
        local_1a8._8_8_ = 0x800000005;
        PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&local_1a8);
      }
      if (bVar9) {
        (*(this->super_PrintLanguage)._vptr_PrintLanguage[0x72])(this,0,4,0,0,op);
      }
    }
    else if (bVar3) {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&addressof,op);
      PrintLanguage::pushOp(&this->super_PrintLanguage,&object_member,op);
      PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m | 0x20);
      local_1a8._M_allocated_capacity = (size_type)local_1f0;
      local_1a8._8_8_ = 0x800000005;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&local_1a8);
    }
    else {
      PrintLanguage::pushOp(&this->super_PrintLanguage,&addressof,op);
      PrintLanguage::pushOp(&this->super_PrintLanguage,&pointer_member,op);
      PrintLanguage::pushVnImplied(&this->super_PrintLanguage,this_00,op,m);
      local_1a8._M_allocated_capacity = (size_type)local_1f0;
      local_1a8._8_8_ = 0x800000005;
      PrintLanguage::pushAtom(&this->super_PrintLanguage,(Atom *)&local_1a8);
    }
    if ((AddrSpace *)local_1f0._0_8_ != (AddrSpace *)(local_1f0 + 0x10)) {
      operator_delete((void *)local_1f0._0_8_);
    }
  }
  return;
}

Assistant:

void PrintC::opPtrsub(const PcodeOp *op)

{
  TypePointer *ptype;
  Datatype *ct;
  const Varnode *in0;
  bool valueon,flex,arrayvalue;
  uint4 m;

  in0 = op->getIn(0);
  ptype = (TypePointer *)in0->getHigh()->getType();
  if (ptype->getMetatype() != TYPE_PTR) {
    clear();
    throw LowlevelError("PTRSUB off of non-pointer type");
  }
  ct = ptype->getPtrTo();
  m = mods & ~(print_load_value|print_store_value); // Current state of mods
  valueon = (mods & (print_load_value|print_store_value)) != 0;
  flex = isValueFlexible(in0);

  if (ct->getMetatype() == TYPE_STRUCT) {
    uintb suboff = op->getIn(1)->getOffset();	// How far into container
    suboff = AddrSpace::addressToByte(suboff,ptype->getWordSize());
    string fieldname;
    Datatype *fieldtype;
    int4 fieldoffset;
    int4 newoff;
    const TypeField *fld = ((TypeStruct *)ct)->getField((int4)suboff,0,&newoff);
    if (fld == (const TypeField *)0) {
      if (ct->getSize() <= suboff)
	throw LowlevelError("PTRSUB out of bounds into struct");
      // Try to match the Ghidra's default field name from DataTypeComponent.getDefaultFieldName
      ostringstream s;
      s << "field_0x" << hex << suboff;
      fieldname = s.str();
      fieldtype = (Datatype *)0;
      fieldoffset = suboff;
    }
    else {
      fieldname = fld->name;
      fieldtype = fld->type;
      fieldoffset = fld->offset;
    }
    arrayvalue = false;
    // The '&' is dropped if the output type is an array
    if ((fieldtype != (Datatype *)0)&&(fieldtype->getMetatype()==TYPE_ARRAY)) {
      arrayvalue = valueon;	// If printing value, use [0]
      valueon = true;		// Don't print &
    }
    
    if (!valueon) {		// Printing an ampersand
      if (flex) {		// EMIT  &( ).name
	pushOp(&addressof,op);
	pushOp(&object_member,op);
	pushVnImplied(in0,op,m | print_load_value);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      else {			// EMIT  &( )->name
	pushOp(&addressof,op);
	pushOp(&pointer_member,op);
	pushVnImplied(in0,op,m);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
    }
    else {			// Not printing an ampersand
      if (arrayvalue)
	pushOp(&subscript,op);
      if (flex) {		// EMIT  ( ).name
	pushOp(&object_member,op);
	pushVnImplied(in0,op,m | print_load_value);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      else {			// EMIT  ( )->name
	pushOp(&pointer_member,op);
	pushVnImplied(in0,op,m);
	pushAtom(Atom(fieldname,fieldtoken,EmitXml::no_color,ct,fieldoffset));
      }
      if (arrayvalue)
	push_integer(0,4,false,(Varnode *)0,op);
    }
  }
  else if (ct->getMetatype() == TYPE_SPACEBASE) {
    TypeSpacebase *sb = (TypeSpacebase *)ct;
    Scope *scope = sb->getMap();
    Address addr = sb->getAddress(op->getIn(1)->getOffset(),in0->getSize(),op->getAddr());
    if (addr.isInvalid())
      throw LowlevelError("Unable to generate proper address from spacebase");
    SymbolEntry *entry = scope->queryContainer(addr,1,Address());
    Datatype *ct = (Datatype *)0;
    arrayvalue = false;
    if (entry != (SymbolEntry *)0) {
      ct = entry->getSymbol()->getType();
	   // The '&' is dropped if the output type is an array
      if (ct->getMetatype()==TYPE_ARRAY) {
	arrayvalue = valueon;	// If printing value, use [0]
	valueon = true;		// If printing ptr, don't use &
      }
      else if (ct->getMetatype()==TYPE_CODE)
	valueon = true;		// If printing ptr, don't use &
    }
    if (!valueon) {		// EMIT  &name
      pushOp(&addressof,op);
    }
    else {			// EMIT  name
      if (arrayvalue)
	pushOp(&subscript,op);
    }
    if (entry == (SymbolEntry *)0)
      pushUnnamedLocation(addr,(Varnode *)0,op);
    else {
      int4 off = (int4)(addr.getOffset() - entry->getAddr().getOffset()) + entry->getOffset();
      if (off == 0)
	pushSymbol(entry->getSymbol(),(Varnode *)0,op);
      else {
	// If this "value" is getting used as a storage location
	// we can't use a cast in its description, so turn off
	// casting when printing the partial symbol
	//	Datatype *exttype = ((mods & print_store_value)!=0) ? (Datatype *)0 : ct;
	pushPartialSymbol(entry->getSymbol(),off,0,(Varnode *)0,op,(Datatype *)0);
      }
    }
    if (arrayvalue)
      push_integer(0,4,false,(Varnode *)0,op);
  }
  else if (ct->getMetatype() == TYPE_ARRAY) {
    if (op->getIn(1)->getOffset() != 0) {
      clear();
      throw LowlevelError("PTRSUB with non-zero offset into array type");
    }
  // We are treating array as a structure
  // and this PTRSUB(*,0) represents changing
  // to treating it as a pointer to its element type
    if (!valueon) {
      if (flex) {		// EMIT  ( )
				// (*&struct->arrayfield)[i]
				// becomes struct->arrayfield[i]
	pushVnImplied(in0,op,m);
      }
      else {			// EMIT  *( )
	pushOp(&dereference,op);
	pushVnImplied(in0,op,m);
      }
    }
    else {
      if (flex) {		// EMIT  ( )[0]
	pushOp(&subscript,op);
	pushVnImplied(in0,op,m);
	push_integer(0,4,false,(Varnode *)0,op);
      }
      else {			// EMIT  (* )[0]
	pushOp(&subscript,op);
	pushOp(&dereference,op);
	pushVnImplied(in0,op,m);
	push_integer(0,4,false,(Varnode *)0,op);
      }
    }
  }
  else {
    clear();
    throw LowlevelError("PTRSUB off of non structured pointer type");
  }
}